

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,void *ptr)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  long lVar3;
  void *local_8;
  
  pIVar1 = GImGui;
  local_8 = ptr;
  lVar3 = (long)(this->IDStack).Size;
  if (0 < lVar3) {
    uVar2 = ~(this->IDStack).Data[lVar3 + -1];
    lVar3 = 0;
    do {
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_8 + lVar3) ^ uVar2 & 0xff]
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    uVar2 = ~uVar2;
    if (GImGui->ActiveId == uVar2) {
      GImGui->ActiveIdIsAlive = uVar2;
    }
    if (pIVar1->ActiveIdPreviousFrame == uVar2) {
      pIVar1->ActiveIdPreviousFrameIsAlive = true;
    }
    return uVar2;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetID(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_Pointer, ptr);
#endif
    return id;
}